

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O0

void __thiscall
btConeTwistConstraint::solveConstraintObsolete
          (btConeTwistConstraint *this,btSolverBody *bodyA,btSolverBody *bodyB,btScalar timeStep)

{
  float *pfVar1;
  btSolverBody *in_RDX;
  btConeTwistConstraint *in_RDI;
  float in_XMM0_Da;
  btScalar bVar2;
  btVector3 bVar3;
  btScalar temp_1;
  btScalar impulseMag_3;
  btScalar relTwistVel;
  btScalar amplitude_1;
  btVector3 noTwistSwingAxis;
  btVector3 impulseNoTwistCouple;
  btVector3 impulseTwistCouple;
  btVector3 impulse_3;
  btScalar temp;
  btScalar impulseMag_2;
  btScalar relSwingVel;
  btScalar amplitude;
  btVector3 angVelB_1;
  btVector3 angVelA_1;
  btVector3 impulseAxis_1;
  btScalar impulseMag_1;
  btVector3 impulse_2;
  btScalar m_kDamping;
  btVector3 relVelAxis;
  btVector3 relVel;
  btVector3 angVelB;
  btVector3 angVelA;
  btVector3 impulseAxis;
  btScalar impulseMag;
  btScalar newUnclampedMag;
  btVector3 newUnclampedAccImpulse;
  btScalar fMaxImpulse;
  btVector3 impulse_1;
  btScalar kInvCombined;
  btVector3 avgAxis;
  btScalar kAxisBInv;
  btScalar kAxisAInv;
  btVector3 axisB;
  btVector3 axisA;
  btVector3 dOmegaB;
  btVector3 dOmegaA;
  btVector3 omegaBDes;
  btVector3 omegaADes;
  btTransform trBDes;
  btTransform trADes;
  btTransform trABDes;
  btTransform trPose;
  btTransform trBPred;
  btVector3 zerovec;
  btTransform trAPred;
  btVector3 omegaB;
  btVector3 omegaA;
  btTransform trBCur;
  btTransform trACur;
  btVector3 ftorqueAxis2;
  btVector3 ftorqueAxis1;
  btScalar impulse;
  btScalar depth;
  btScalar rel_vel;
  btScalar jacDiagABInv;
  btVector3 *normal;
  int i;
  btVector3 vel;
  btVector3 vel2;
  btVector3 vel1;
  btVector3 rel_pos2;
  btVector3 rel_pos1;
  btScalar tau;
  btVector3 pivotBInW;
  btVector3 pivotAInW;
  btTransform *in_stack_fffffffffffff638;
  btTransform *in_stack_fffffffffffff640;
  btVector3 *in_stack_fffffffffffff648;
  btVector3 *pbVar4;
  btRigidBody *in_stack_fffffffffffff650;
  btVector3 *m;
  btVector3 *in_stack_fffffffffffff680;
  btVector3 *in_stack_fffffffffffff688;
  btScalar impulseMagnitude;
  btSolverBody *in_stack_fffffffffffff690;
  btTransform *in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff6a0;
  btScalar in_stack_fffffffffffff6a4;
  btTransform *in_stack_fffffffffffff6a8;
  btVector3 *in_stack_fffffffffffff6b0;
  btVector3 *in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6c0;
  btTransform *in_stack_fffffffffffff6c8;
  btTransform *in_stack_fffffffffffff6d0;
  btTransform *in_stack_fffffffffffff700;
  undefined8 in_stack_fffffffffffff708;
  btScalar timeStep_00;
  btVector3 *in_stack_fffffffffffff710;
  btVector3 *in_stack_fffffffffffff718;
  btTransform *in_stack_fffffffffffff720;
  btScalar local_7f4;
  btScalar local_7f0;
  btScalar local_7ec;
  btVector3 local_7e8;
  undefined8 local_7d8;
  undefined8 local_7d0;
  btScalar local_7c8;
  btScalar local_7c4;
  btScalar local_7c0;
  btVector3 local_7bc;
  float local_7ac;
  float local_7a8;
  float local_7a4;
  float local_7a0;
  btVector3 local_79c;
  btScalar local_78c;
  float local_788;
  undefined8 local_784;
  undefined8 local_77c;
  btScalar local_774;
  btScalar local_770;
  btScalar local_76c;
  btVector3 local_768;
  undefined8 local_758;
  undefined8 local_750;
  btScalar local_748;
  btScalar local_744;
  btScalar local_740;
  btVector3 local_73c;
  undefined8 local_72c;
  undefined8 local_724;
  btScalar local_71c [2];
  btScalar abStack_714 [2];
  btScalar local_70c;
  undefined8 local_708;
  undefined8 local_700;
  btVector3 local_6f8;
  float local_6e0;
  float local_6dc;
  float local_6d8;
  float local_6d4;
  btVector3 local_6d0;
  btScalar local_6c0;
  float local_6bc;
  btVector3 local_6b8;
  btVector3 local_6a8;
  undefined8 local_698;
  undefined8 local_690;
  btScalar local_688;
  btScalar local_684;
  btScalar local_680;
  btVector3 local_67c;
  undefined8 local_66c;
  undefined8 local_664;
  btScalar local_65c;
  btScalar local_658;
  btScalar local_654;
  btVector3 local_650;
  undefined8 local_640;
  undefined8 local_638;
  btScalar local_630;
  float local_62c;
  undefined8 local_628;
  undefined8 local_620;
  float local_618;
  btTransform local_614;
  undefined8 local_5d4;
  undefined8 local_5cc;
  btScalar local_5c4;
  btScalar local_5c0;
  btScalar local_5bc;
  btVector3 local_5b8;
  undefined8 local_5a8;
  undefined8 local_5a0;
  btScalar local_598;
  btScalar local_594;
  btScalar local_590;
  btVector3 local_58c;
  undefined8 local_57c;
  undefined8 local_574;
  btScalar local_56c;
  btScalar local_568 [2];
  btScalar local_560 [2];
  btScalar local_558;
  btVector3 local_554;
  float local_544;
  float local_540;
  undefined8 local_53c;
  undefined8 local_534;
  undefined8 local_52c;
  undefined8 local_524;
  undefined8 local_51c;
  undefined8 local_514;
  btVector3 local_50c;
  float local_4fc;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  btScalar local_4c8 [2];
  btScalar local_4c0 [2];
  btScalar local_4b8 [2];
  btScalar local_4b0 [2];
  btScalar local_4a8;
  btScalar local_4a4;
  btVector3 local_4a0;
  btVector3 local_490;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  btVector3 local_460;
  btVector3 local_450 [25];
  btScalar local_2c0;
  btScalar local_2bc;
  btScalar local_2b8;
  btVector3 local_2b4 [9];
  btScalar local_224;
  btScalar local_220;
  btScalar local_21c;
  btVector3 local_218 [5];
  btVector3 local_1c8;
  btVector3 local_1b8 [9];
  undefined8 local_128;
  undefined8 local_120;
  btScalar local_118;
  undefined8 local_114;
  undefined8 local_10c;
  undefined8 local_104;
  undefined8 local_fc;
  btScalar local_f4;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  float local_c0;
  btVector3 local_bc;
  float local_ac;
  btScalar local_a8;
  float local_a4;
  btJacobianEntry *local_a0;
  int local_94;
  btVector3 local_90;
  btVector3 local_80;
  btVector3 local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  float local_40;
  undefined8 local_3c;
  undefined8 local_34;
  undefined8 local_2c;
  undefined8 local_24;
  float local_1c;
  btSolverBody *local_18;
  
  if ((in_RDI->m_useSolveConstraintObsolete & 1U) != 0) {
    local_1c = in_XMM0_Da;
    local_18 = in_RDX;
    btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
    btTransform::getOrigin(&in_RDI->m_rbAFrame);
    bVar3 = btTransform::operator*(in_stack_fffffffffffff640,(btVector3 *)in_stack_fffffffffffff638)
    ;
    local_2c = bVar3.m_floats._0_8_;
    local_24 = bVar3.m_floats._8_8_;
    btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
    btTransform::getOrigin(&in_RDI->m_rbBFrame);
    bVar3 = btTransform::operator*(in_stack_fffffffffffff640,(btVector3 *)in_stack_fffffffffffff638)
    ;
    bVar2 = (btScalar)((ulong)in_stack_fffffffffffff6c0 >> 0x20);
    timeStep_00 = (btScalar)((ulong)in_stack_fffffffffffff708 >> 0x20);
    local_3c = bVar3.m_floats._0_8_;
    local_34 = bVar3.m_floats._8_8_;
    local_40 = 0.3;
    if ((in_RDI->m_angularOnly & 1U) == 0) {
      btRigidBody::getCenterOfMassPosition((btRigidBody *)0x1fa5ca);
      bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_50 = bVar3.m_floats._0_8_;
      local_48 = bVar3.m_floats._8_8_;
      btRigidBody::getCenterOfMassPosition((btRigidBody *)0x1fa5fd);
      bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_60 = bVar3.m_floats._0_8_;
      local_58 = bVar3.m_floats._8_8_;
      btVector3::btVector3(&local_70);
      btSolverBody::internalGetVelocityInLocalPointObsolete
                (in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff680);
      btVector3::btVector3(&local_80);
      btSolverBody::internalGetVelocityInLocalPointObsolete
                (in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff680);
      bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_90.m_floats._0_8_ = bVar3.m_floats._0_8_;
      local_90.m_floats._8_8_ = bVar3.m_floats._8_8_;
      local_94 = 0;
      while( true ) {
        bVar2 = (btScalar)((ulong)in_stack_fffffffffffff6c0 >> 0x20);
        timeStep_00 = (btScalar)((ulong)in_stack_fffffffffffff708 >> 0x20);
        if (2 < local_94) break;
        local_a0 = in_RDI->m_jac + local_94;
        bVar2 = btJacobianEntry::getDiagonal(in_RDI->m_jac + local_94);
        local_a4 = 1.0 / bVar2;
        local_a8 = btVector3::dot(&local_a0->m_linearJointAxis,&local_90);
        bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_bc.m_floats._0_8_ = bVar3.m_floats._0_8_;
        local_bc.m_floats._8_8_ = bVar3.m_floats._8_8_;
        bVar2 = btVector3::dot(&local_bc,&local_a0->m_linearJointAxis);
        local_ac = -bVar2;
        local_c0 = ((local_ac * local_40) / local_1c) * local_a4 - local_a8 * local_a4;
        (in_RDI->super_btTypedConstraint).m_appliedImpulse =
             (in_RDI->super_btTypedConstraint).m_appliedImpulse + local_c0;
        bVar3 = btVector3::cross((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_d0 = bVar3.m_floats._0_8_;
        local_c8 = bVar3.m_floats._8_8_;
        bVar3 = btVector3::cross((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_e0 = bVar3.m_floats._0_8_;
        local_d8 = bVar3.m_floats._8_8_;
        local_f4 = btRigidBody::getInvMass((in_RDI->super_btTypedConstraint).m_rbA);
        bVar3 = ::operator*((btVector3 *)in_stack_fffffffffffff650,
                            in_stack_fffffffffffff648->m_floats);
        local_f0 = bVar3.m_floats._0_8_;
        local_e8 = bVar3.m_floats._8_8_;
        btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbA);
        bVar3 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_104 = bVar3.m_floats._0_8_;
        local_fc = bVar3.m_floats._8_8_;
        btSolverBody::internalApplyImpulse
                  ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                   (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                   (btScalar)((ulong)in_stack_fffffffffffff688 >> 0x20));
        local_118 = btRigidBody::getInvMass((in_RDI->super_btTypedConstraint).m_rbB);
        bVar3 = ::operator*((btVector3 *)in_stack_fffffffffffff650,
                            in_stack_fffffffffffff648->m_floats);
        local_114 = bVar3.m_floats._0_8_;
        local_10c = bVar3.m_floats._8_8_;
        btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbB);
        bVar3 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_128 = bVar3.m_floats._0_8_;
        local_120 = bVar3.m_floats._8_8_;
        btSolverBody::internalApplyImpulse
                  ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                   (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                   (btScalar)((ulong)in_stack_fffffffffffff688 >> 0x20));
        local_94 = local_94 + 1;
      }
    }
    impulseMagnitude = (btScalar)((ulong)in_stack_fffffffffffff688 >> 0x20);
    if ((in_RDI->m_bMotorEnabled & 1U) == 0) {
      if (1.1920929e-07 < in_RDI->m_damping) {
        btVector3::btVector3(&local_614.m_origin);
        btSolverBody::internalGetAngularVelocity
                  ((btSolverBody *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        btVector3::btVector3(local_614.m_basis.m_el + 2);
        btSolverBody::internalGetAngularVelocity
                  ((btSolverBody *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_614.m_basis.m_el[1].m_floats._0_8_ = bVar3.m_floats._0_8_;
        local_614.m_basis.m_el[1].m_floats._8_8_ = bVar3.m_floats._8_8_;
        bVar2 = btVector3::length2((btVector3 *)0x1fb466);
        if (1.1920929e-07 < bVar2) {
          bVar3 = btVector3::normalized(in_stack_fffffffffffff648);
          local_614.m_basis.m_el[0].m_floats._0_8_ = bVar3.m_floats._0_8_;
          local_614.m_basis.m_el[0].m_floats._8_8_ = bVar3.m_floats._8_8_;
          getRigidBodyA(in_RDI);
          in_stack_fffffffffffff698 = &local_614;
          in_stack_fffffffffffff6a4 =
               btRigidBody::computeAngularImpulseDenominator
                         (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
          getRigidBodyB(in_RDI);
          bVar2 = btRigidBody::computeAngularImpulseDenominator
                            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
          local_618 = 1.0 / (in_stack_fffffffffffff6a4 + bVar2);
          local_62c = in_RDI->m_damping * local_618;
          bVar3 = ::operator*((btScalar *)in_stack_fffffffffffff640,
                              (btVector3 *)in_stack_fffffffffffff638);
          local_628 = bVar3.m_floats._0_8_;
          local_620 = bVar3.m_floats._8_8_;
          local_630 = btVector3::length((btVector3 *)0x1fb558);
          bVar3 = operator/((btVector3 *)in_stack_fffffffffffff640,
                            (btScalar *)in_stack_fffffffffffff638);
          local_640 = bVar3.m_floats._0_8_;
          local_638 = bVar3.m_floats._8_8_;
          local_654 = 0.0;
          local_658 = 0.0;
          local_65c = 0.0;
          btVector3::btVector3(&local_650,&local_654,&local_658,&local_65c);
          btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbA);
          bVar3 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
          local_66c = bVar3.m_floats._0_8_;
          local_664 = bVar3.m_floats._8_8_;
          btSolverBody::internalApplyImpulse
                    ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                     (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                     impulseMagnitude);
          local_680 = 0.0;
          local_684 = 0.0;
          local_688 = 0.0;
          btVector3::btVector3(&local_67c,&local_680,&local_684,&local_688);
          btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbB);
          bVar3 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
          local_698 = bVar3.m_floats._0_8_;
          local_690 = bVar3.m_floats._8_8_;
          btSolverBody::internalApplyImpulse
                    ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                     (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                     impulseMagnitude);
        }
      }
    }
    else {
      btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
      btTransform::btTransform(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
      btTransform::btTransform(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      btVector3::btVector3(local_1b8);
      btSolverBody::internalGetAngularVelocity
                ((btSolverBody *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      btVector3::btVector3(&local_1c8);
      btSolverBody::internalGetAngularVelocity
                ((btSolverBody *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      btTransform::btTransform(in_stack_fffffffffffff640);
      btTransform::setIdentity((btTransform *)in_stack_fffffffffffff650);
      local_21c = 0.0;
      local_220 = 0.0;
      local_224 = 0.0;
      btVector3::btVector3(local_218,&local_21c,&local_220,&local_224);
      btTransformUtil::integrateTransform
                (in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                 timeStep_00,in_stack_fffffffffffff700);
      btTransform::btTransform(in_stack_fffffffffffff640);
      btTransform::setIdentity((btTransform *)in_stack_fffffffffffff650);
      btTransformUtil::integrateTransform
                (in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                 timeStep_00,in_stack_fffffffffffff700);
      local_2b8 = 0.0;
      local_2bc = 0.0;
      local_2c0 = 0.0;
      btVector3::btVector3(local_2b4,&local_2b8,&local_2bc,&local_2c0);
      btTransform::btTransform
                ((btTransform *)in_stack_fffffffffffff650,(btQuaternion *)in_stack_fffffffffffff648,
                 (btVector3 *)in_stack_fffffffffffff640);
      btTransform::operator*(in_stack_fffffffffffff698,&in_stack_fffffffffffff690->m_worldTransform)
      ;
      btTransform::inverse(in_stack_fffffffffffff6a8);
      btTransform::operator*(in_stack_fffffffffffff698,&in_stack_fffffffffffff690->m_worldTransform)
      ;
      btTransform::operator*(in_stack_fffffffffffff698,&in_stack_fffffffffffff690->m_worldTransform)
      ;
      btTransform::inverse(in_stack_fffffffffffff6a8);
      btTransform::operator*(in_stack_fffffffffffff698,&in_stack_fffffffffffff690->m_worldTransform)
      ;
      btVector3::btVector3(local_450);
      btVector3::btVector3(&local_460);
      btTransformUtil::calculateVelocity
                (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,bVar2,in_stack_fffffffffffff6b8
                 ,in_stack_fffffffffffff6b0);
      btTransformUtil::calculateVelocity
                (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,bVar2,in_stack_fffffffffffff6b8
                 ,in_stack_fffffffffffff6b0);
      bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_470 = bVar3.m_floats._0_8_;
      local_468 = bVar3.m_floats._8_8_;
      bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_480 = bVar3.m_floats._0_8_;
      local_478 = bVar3.m_floats._8_8_;
      btVector3::btVector3(&local_490);
      btVector3::btVector3(&local_4a0);
      local_4a4 = 0.0;
      local_4a8 = 0.0;
      bVar2 = btVector3::length2((btVector3 *)0x1fadf1);
      if (1.1920929e-07 < bVar2) {
        bVar3 = btVector3::normalized(in_stack_fffffffffffff648);
        local_4b8 = bVar3.m_floats._0_8_;
        local_4b0 = bVar3.m_floats._8_8_;
        local_490.m_floats._0_8_ = local_4b8;
        local_490.m_floats._8_8_ = local_4b0;
        getRigidBodyA(in_RDI);
        local_4a4 = btRigidBody::computeAngularImpulseDenominator
                              (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      }
      bVar2 = btVector3::length2((btVector3 *)0x1fae70);
      if (1.1920929e-07 < bVar2) {
        bVar3 = btVector3::normalized(in_stack_fffffffffffff648);
        local_4c8 = bVar3.m_floats._0_8_;
        local_4c0 = bVar3.m_floats._8_8_;
        local_4a0.m_floats._0_8_ = local_4c8;
        local_4a0.m_floats._8_8_ = local_4c0;
        getRigidBodyB(in_RDI);
        local_4a8 = btRigidBody::computeAngularImpulseDenominator
                              (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      }
      bVar3 = ::operator*((btScalar *)in_stack_fffffffffffff640,
                          (btVector3 *)in_stack_fffffffffffff638);
      local_4e8 = bVar3.m_floats._0_8_;
      local_4e0 = bVar3.m_floats._8_8_;
      bVar3 = ::operator*((btScalar *)in_stack_fffffffffffff640,
                          (btVector3 *)in_stack_fffffffffffff638);
      local_4f8 = bVar3.m_floats._0_8_;
      local_4f0 = bVar3.m_floats._8_8_;
      bVar3 = operator+((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_4d8 = bVar3.m_floats._0_8_;
      local_4d0 = bVar3.m_floats._8_8_;
      if (((solveConstraintObsolete::bDoTorque & 1U) != 0) &&
         (bVar2 = btVector3::length2((btVector3 *)0x1faf71), 1.1920929e-07 < bVar2)) {
        btVector3::normalize((btVector3 *)in_stack_fffffffffffff640);
        getRigidBodyA(in_RDI);
        local_4a4 = btRigidBody::computeAngularImpulseDenominator
                              (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        getRigidBodyB(in_RDI);
        local_4a8 = btRigidBody::computeAngularImpulseDenominator
                              (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_4fc = local_4a4 + local_4a8;
        bVar3 = ::operator*((btScalar *)in_stack_fffffffffffff640,
                            (btVector3 *)in_stack_fffffffffffff638);
        local_52c = bVar3.m_floats._0_8_;
        local_524 = bVar3.m_floats._8_8_;
        bVar3 = ::operator*((btScalar *)in_stack_fffffffffffff640,
                            (btVector3 *)in_stack_fffffffffffff638);
        local_53c = bVar3.m_floats._0_8_;
        local_534 = bVar3.m_floats._8_8_;
        bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_51c = bVar3.m_floats._0_8_;
        local_514 = bVar3.m_floats._8_8_;
        local_540 = local_4fc * local_4fc;
        bVar3 = operator/((btVector3 *)in_stack_fffffffffffff640,
                          (btScalar *)in_stack_fffffffffffff638);
        local_50c.m_floats._0_8_ = bVar3.m_floats._0_8_;
        local_50c.m_floats._8_8_ = bVar3.m_floats._8_8_;
        if (0.0 <= in_RDI->m_maxMotorImpulse) {
          local_544 = in_RDI->m_maxMotorImpulse;
          if ((in_RDI->m_bNormalizedMotorStrength & 1U) != 0) {
            local_544 = local_544 / local_4a4;
          }
          bVar3 = operator+((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
          local_554.m_floats._0_8_ = bVar3.m_floats._0_8_;
          local_554.m_floats._8_8_ = bVar3.m_floats._8_8_;
          local_558 = btVector3::length((btVector3 *)0x1fb148);
          if (local_544 < local_558) {
            pbVar4 = &local_554;
            btVector3::normalize((btVector3 *)in_stack_fffffffffffff640);
            btVector3::operator*=(pbVar4,&local_544);
            bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
            local_568 = bVar3.m_floats._0_8_;
            local_560 = bVar3.m_floats._8_8_;
            local_50c.m_floats._0_8_ = local_568;
            local_50c.m_floats._8_8_ = local_560;
          }
          btVector3::operator+=(&in_RDI->m_accMotorImpulse,&local_50c);
        }
        local_56c = btVector3::length((btVector3 *)0x1fb20d);
        bVar3 = operator/((btVector3 *)in_stack_fffffffffffff640,
                          (btScalar *)in_stack_fffffffffffff638);
        local_57c = bVar3.m_floats._0_8_;
        local_574 = bVar3.m_floats._8_8_;
        local_590 = 0.0;
        local_594 = 0.0;
        local_598 = 0.0;
        btVector3::btVector3(&local_58c,&local_590,&local_594,&local_598);
        btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbA);
        bVar3 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_5a8 = bVar3.m_floats._0_8_;
        local_5a0 = bVar3.m_floats._8_8_;
        btSolverBody::internalApplyImpulse
                  ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                   (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                   impulseMagnitude);
        local_5bc = 0.0;
        local_5c0 = 0.0;
        local_5c4 = 0.0;
        btVector3::btVector3(&local_5b8,&local_5bc,&local_5c0,&local_5c4);
        btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbB);
        bVar3 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_5d4 = bVar3.m_floats._0_8_;
        local_5cc = bVar3.m_floats._8_8_;
        btSolverBody::internalApplyImpulse
                  ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                   (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                   impulseMagnitude);
      }
    }
    btVector3::btVector3(&local_6a8);
    btSolverBody::internalGetAngularVelocity
              ((btSolverBody *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
    btVector3::btVector3(&local_6b8);
    btSolverBody::internalGetAngularVelocity
              ((btSolverBody *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
    if ((in_RDI->m_solveSwingLimit & 1U) != 0) {
      local_6bc = (in_RDI->m_swingLimitRatio * in_RDI->m_swingCorrection * in_RDI->m_biasFactor) /
                  local_1c;
      bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_6d0.m_floats._0_8_ = bVar3.m_floats._0_8_;
      local_6d0.m_floats._8_8_ = bVar3.m_floats._8_8_;
      local_6c0 = btVector3::dot(&local_6d0,&in_RDI->m_swingAxis);
      if (0.0 < local_6c0) {
        local_6bc = in_RDI->m_swingLimitRatio * local_6c0 * in_RDI->m_relaxationFactor + local_6bc;
      }
      local_6d4 = local_6bc * in_RDI->m_kSwing;
      local_6d8 = in_RDI->m_accSwingLimitImpulse;
      local_6dc = in_RDI->m_accSwingLimitImpulse + local_6d4;
      local_6e0 = 0.0;
      pfVar1 = btMax<float>(&local_6dc,&local_6e0);
      in_RDI->m_accSwingLimitImpulse = *pfVar1;
      local_6d4 = in_RDI->m_accSwingLimitImpulse - local_6d8;
      bVar3 = ::operator*((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648->m_floats
                         );
      local_6f8.m_floats._0_8_ = bVar3.m_floats._0_8_;
      local_6f8.m_floats._8_8_ = bVar3.m_floats._8_8_;
      local_70c = btVector3::dot(&local_6f8,&in_RDI->m_twistAxisA);
      bVar3 = ::operator*((btScalar *)in_stack_fffffffffffff640,
                          (btVector3 *)in_stack_fffffffffffff638);
      local_708 = bVar3.m_floats._0_8_;
      local_700 = bVar3.m_floats._8_8_;
      bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_71c = bVar3.m_floats._0_8_;
      abStack_714 = bVar3.m_floats._8_8_;
      local_6f8.m_floats._0_8_ = local_71c;
      local_6f8.m_floats._8_8_ = abStack_714;
      local_6d4 = btVector3::length((btVector3 *)0x1fb996);
      bVar3 = operator/((btVector3 *)in_stack_fffffffffffff640,(btScalar *)in_stack_fffffffffffff638
                       );
      local_72c = bVar3.m_floats._0_8_;
      local_724 = bVar3.m_floats._8_8_;
      local_740 = 0.0;
      local_744 = 0.0;
      local_748 = 0.0;
      btVector3::btVector3(&local_73c,&local_740,&local_744,&local_748);
      btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbA);
      impulseMagnitude = (btScalar)((ulong)&local_72c >> 0x20);
      bVar3 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_758 = bVar3.m_floats._0_8_;
      local_750 = bVar3.m_floats._8_8_;
      btSolverBody::internalApplyImpulse
                ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                 (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                 impulseMagnitude);
      local_76c = 0.0;
      local_770 = 0.0;
      local_774 = 0.0;
      btVector3::btVector3(&local_768,&local_76c,&local_770,&local_774);
      btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbB);
      bVar3 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_784 = bVar3.m_floats._0_8_;
      local_77c = bVar3.m_floats._8_8_;
      btSolverBody::internalApplyImpulse
                ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                 (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)local_18,impulseMagnitude);
      in_stack_fffffffffffff690 = local_18;
    }
    if ((in_RDI->m_solveTwistLimit & 1U) != 0) {
      local_788 = (in_RDI->m_twistLimitRatio * in_RDI->m_twistCorrection * in_RDI->m_biasFactor) /
                  local_1c;
      bVar3 = operator-((btVector3 *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      local_79c.m_floats._0_8_ = bVar3.m_floats._0_8_;
      local_79c.m_floats._8_8_ = bVar3.m_floats._8_8_;
      local_78c = btVector3::dot(&local_79c,&in_RDI->m_twistAxis);
      if (0.0 < local_78c) {
        local_788 = in_RDI->m_twistLimitRatio * local_78c * in_RDI->m_relaxationFactor + local_788;
      }
      local_7a0 = local_788 * in_RDI->m_kTwist;
      local_7a4 = in_RDI->m_accTwistLimitImpulse;
      local_7a8 = in_RDI->m_accTwistLimitImpulse + local_7a0;
      local_7ac = 0.0;
      pfVar1 = btMax<float>(&local_7a8,&local_7ac);
      in_RDI->m_accTwistLimitImpulse = *pfVar1;
      local_7a0 = in_RDI->m_accTwistLimitImpulse - local_7a4;
      local_7c0 = 0.0;
      local_7c4 = 0.0;
      local_7c8 = 0.0;
      pbVar4 = &local_7bc;
      btVector3::btVector3(pbVar4,&local_7c0,&local_7c4,&local_7c8);
      btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbA);
      m = &in_RDI->m_twistAxis;
      bVar3 = ::operator*((btMatrix3x3 *)m,pbVar4);
      local_7d8 = bVar3.m_floats._0_8_;
      local_7d0 = bVar3.m_floats._8_8_;
      btSolverBody::internalApplyImpulse
                ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                 (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                 impulseMagnitude);
      local_7ec = 0.0;
      local_7f0 = 0.0;
      local_7f4 = 0.0;
      btVector3::btVector3(&local_7e8,&local_7ec,&local_7f0,&local_7f4);
      btRigidBody::getInvInertiaTensorWorld((in_RDI->super_btTypedConstraint).m_rbB);
      ::operator*((btMatrix3x3 *)m,pbVar4);
      btSolverBody::internalApplyImpulse
                ((btSolverBody *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                 (btVector3 *)in_stack_fffffffffffff698,(btVector3 *)in_stack_fffffffffffff690,
                 impulseMagnitude);
    }
  }
  return;
}

Assistant:

void	btConeTwistConstraint::solveConstraintObsolete(btSolverBody& bodyA,btSolverBody& bodyB,btScalar	timeStep)
{
	#ifndef __SPU__
	if (m_useSolveConstraintObsolete)
	{
		btVector3 pivotAInW = m_rbA.getCenterOfMassTransform()*m_rbAFrame.getOrigin();
		btVector3 pivotBInW = m_rbB.getCenterOfMassTransform()*m_rbBFrame.getOrigin();

		btScalar tau = btScalar(0.3);

		//linear part
		if (!m_angularOnly)
		{
			btVector3 rel_pos1 = pivotAInW - m_rbA.getCenterOfMassPosition(); 
			btVector3 rel_pos2 = pivotBInW - m_rbB.getCenterOfMassPosition();

			btVector3 vel1;
			bodyA.internalGetVelocityInLocalPointObsolete(rel_pos1,vel1);
			btVector3 vel2;
			bodyB.internalGetVelocityInLocalPointObsolete(rel_pos2,vel2);
			btVector3 vel = vel1 - vel2;

			for (int i=0;i<3;i++)
			{		
				const btVector3& normal = m_jac[i].m_linearJointAxis;
				btScalar jacDiagABInv = btScalar(1.) / m_jac[i].getDiagonal();

				btScalar rel_vel;
				rel_vel = normal.dot(vel);
				//positional error (zeroth order error)
				btScalar depth = -(pivotAInW - pivotBInW).dot(normal); //this is the error projected on the normal
				btScalar impulse = depth*tau/timeStep  * jacDiagABInv -  rel_vel * jacDiagABInv;
				m_appliedImpulse += impulse;
				
				btVector3 ftorqueAxis1 = rel_pos1.cross(normal);
				btVector3 ftorqueAxis2 = rel_pos2.cross(normal);
				bodyA.internalApplyImpulse(normal*m_rbA.getInvMass(), m_rbA.getInvInertiaTensorWorld()*ftorqueAxis1,impulse);
				bodyB.internalApplyImpulse(normal*m_rbB.getInvMass(), m_rbB.getInvInertiaTensorWorld()*ftorqueAxis2,-impulse);
		
			}
		}

		// apply motor
		if (m_bMotorEnabled)
		{
			// compute current and predicted transforms
			btTransform trACur = m_rbA.getCenterOfMassTransform();
			btTransform trBCur = m_rbB.getCenterOfMassTransform();
			btVector3 omegaA; bodyA.internalGetAngularVelocity(omegaA);
			btVector3 omegaB; bodyB.internalGetAngularVelocity(omegaB);
			btTransform trAPred; trAPred.setIdentity(); 
			btVector3 zerovec(0,0,0);
			btTransformUtil::integrateTransform(
				trACur, zerovec, omegaA, timeStep, trAPred);
			btTransform trBPred; trBPred.setIdentity(); 
			btTransformUtil::integrateTransform(
				trBCur, zerovec, omegaB, timeStep, trBPred);

			// compute desired transforms in world
			btTransform trPose(m_qTarget);
			btTransform trABDes = m_rbBFrame * trPose * m_rbAFrame.inverse();
			btTransform trADes = trBPred * trABDes;
			btTransform trBDes = trAPred * trABDes.inverse();

			// compute desired omegas in world
			btVector3 omegaADes, omegaBDes;
			
			btTransformUtil::calculateVelocity(trACur, trADes, timeStep, zerovec, omegaADes);
			btTransformUtil::calculateVelocity(trBCur, trBDes, timeStep, zerovec, omegaBDes);

			// compute delta omegas
			btVector3 dOmegaA = omegaADes - omegaA;
			btVector3 dOmegaB = omegaBDes - omegaB;

			// compute weighted avg axis of dOmega (weighting based on inertias)
			btVector3 axisA, axisB;
			btScalar kAxisAInv = 0, kAxisBInv = 0;

			if (dOmegaA.length2() > SIMD_EPSILON)
			{
				axisA = dOmegaA.normalized();
				kAxisAInv = getRigidBodyA().computeAngularImpulseDenominator(axisA);
			}

			if (dOmegaB.length2() > SIMD_EPSILON)
			{
				axisB = dOmegaB.normalized();
				kAxisBInv = getRigidBodyB().computeAngularImpulseDenominator(axisB);
			}

			btVector3 avgAxis = kAxisAInv * axisA + kAxisBInv * axisB;

			static bool bDoTorque = true;
			if (bDoTorque && avgAxis.length2() > SIMD_EPSILON)
			{
				avgAxis.normalize();
				kAxisAInv = getRigidBodyA().computeAngularImpulseDenominator(avgAxis);
				kAxisBInv = getRigidBodyB().computeAngularImpulseDenominator(avgAxis);
				btScalar kInvCombined = kAxisAInv + kAxisBInv;

				btVector3 impulse = (kAxisAInv * dOmegaA - kAxisBInv * dOmegaB) /
									(kInvCombined * kInvCombined);

				if (m_maxMotorImpulse >= 0)
				{
					btScalar fMaxImpulse = m_maxMotorImpulse;
					if (m_bNormalizedMotorStrength)
						fMaxImpulse = fMaxImpulse/kAxisAInv;

					btVector3 newUnclampedAccImpulse = m_accMotorImpulse + impulse;
					btScalar  newUnclampedMag = newUnclampedAccImpulse.length();
					if (newUnclampedMag > fMaxImpulse)
					{
						newUnclampedAccImpulse.normalize();
						newUnclampedAccImpulse *= fMaxImpulse;
						impulse = newUnclampedAccImpulse - m_accMotorImpulse;
					}
					m_accMotorImpulse += impulse;
				}

				btScalar  impulseMag  = impulse.length();
				btVector3 impulseAxis =  impulse / impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*impulseAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*impulseAxis, -impulseMag);

			}
		}
		else if (m_damping > SIMD_EPSILON) // no motor: do a little damping
		{
			btVector3 angVelA; bodyA.internalGetAngularVelocity(angVelA);
			btVector3 angVelB; bodyB.internalGetAngularVelocity(angVelB);
			btVector3 relVel = angVelB - angVelA;
			if (relVel.length2() > SIMD_EPSILON)
			{
				btVector3 relVelAxis = relVel.normalized();
				btScalar m_kDamping =  btScalar(1.) /
					(getRigidBodyA().computeAngularImpulseDenominator(relVelAxis) +
					 getRigidBodyB().computeAngularImpulseDenominator(relVelAxis));
				btVector3 impulse = m_damping * m_kDamping * relVel;

				btScalar  impulseMag  = impulse.length();
				btVector3 impulseAxis = impulse / impulseMag;
				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*impulseAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*impulseAxis, -impulseMag);
			}
		}

		// joint limits
		{
			///solve angular part
			btVector3 angVelA;
			bodyA.internalGetAngularVelocity(angVelA);
			btVector3 angVelB;
			bodyB.internalGetAngularVelocity(angVelB);

			// solve swing limit
			if (m_solveSwingLimit)
			{
				btScalar amplitude = m_swingLimitRatio * m_swingCorrection*m_biasFactor/timeStep;
				btScalar relSwingVel = (angVelB - angVelA).dot(m_swingAxis);
				if (relSwingVel > 0)
					amplitude += m_swingLimitRatio * relSwingVel * m_relaxationFactor;
				btScalar impulseMag = amplitude * m_kSwing;

				// Clamp the accumulated impulse
				btScalar temp = m_accSwingLimitImpulse;
				m_accSwingLimitImpulse = btMax(m_accSwingLimitImpulse + impulseMag, btScalar(0.0) );
				impulseMag = m_accSwingLimitImpulse - temp;

				btVector3 impulse = m_swingAxis * impulseMag;

				// don't let cone response affect twist
				// (this can happen since body A's twist doesn't match body B's AND we use an elliptical cone limit)
				{
					btVector3 impulseTwistCouple = impulse.dot(m_twistAxisA) * m_twistAxisA;
					btVector3 impulseNoTwistCouple = impulse - impulseTwistCouple;
					impulse = impulseNoTwistCouple;
				}

				impulseMag = impulse.length();
				btVector3 noTwistSwingAxis = impulse / impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*noTwistSwingAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*noTwistSwingAxis, -impulseMag);
			}


			// solve twist limit
			if (m_solveTwistLimit)
			{
				btScalar amplitude = m_twistLimitRatio * m_twistCorrection*m_biasFactor/timeStep;
				btScalar relTwistVel = (angVelB - angVelA).dot( m_twistAxis );
				if (relTwistVel > 0) // only damp when moving towards limit (m_twistAxis flipping is important)
					amplitude += m_twistLimitRatio * relTwistVel * m_relaxationFactor;
				btScalar impulseMag = amplitude * m_kTwist;

				// Clamp the accumulated impulse
				btScalar temp = m_accTwistLimitImpulse;
				m_accTwistLimitImpulse = btMax(m_accTwistLimitImpulse + impulseMag, btScalar(0.0) );
				impulseMag = m_accTwistLimitImpulse - temp;

		//		btVector3 impulse = m_twistAxis * impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*m_twistAxis,impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*m_twistAxis,-impulseMag);
			}		
		}
	}
#else
btAssert(0);
#endif //__SPU__
}